

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActivationFunction.cpp
# Opt level: O0

float __thiscall nanoNet::ActivationFunction::operator()(ActivationFunction *this,float x)

{
  float x_local;
  ActivationFunction *this_local;
  
  switch(this->m_option) {
  case Sigmoid:
    this_local._4_4_ = sigmoid_activation(x);
    break;
  case Tanh:
    this_local._4_4_ = tanh_activation(x);
    break;
  case Relu:
    this_local._4_4_ = relu_activation(x);
    break;
  case Linear:
    this_local._4_4_ = linear_activation(x);
    break;
  default:
    this_local._4_4_ = sigmoid_activation(x);
  }
  return this_local._4_4_;
}

Assistant:

float ActivationFunction::operator()(float x) const
{
    switch (m_option)
    {
    case Sigmoid:
        return sigmoid_activation(x);
    case Tanh:
        return tanh_activation(x);
    case Relu:
        return relu_activation(x);
    case Linear:
        return linear_activation(x);
    default:
        return sigmoid_activation(x);
    }
}